

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::Impl<0UL,_false>
::insert(Impl<0UL,_false> *this,
        Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
        size_t pos,StringPtr *row,uint skip)

{
  MaybeUint MVar1;
  uint uVar2;
  bool bVar3;
  void *pvVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  ulong uVar6;
  Maybe<unsigned_long> MVar7;
  bool success;
  undefined1 local_9c [20];
  Iterator local_88;
  StringPtr *local_70;
  long local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip == 0) {
    *this = (Impl<0UL,_false>)0x0;
    goto LAB_0016d12a;
  }
  local_9c._4_8_ = &table->indexes;
  local_70 = (table->rows).builder.ptr;
  local_68 = (long)(table->rows).builder.pos - (long)local_70 >> 2;
  local_9c._0_4_ = *(undefined4 *)&(row->content).ptr;
  local_60.maybeFunc.ptr.field_1.value.table =
       (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)local_9c;
  local_60.maybeFunc.ptr.field_1.value.indexObj =
       (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&local_70;
  local_60.maybeFunc.ptr._0_8_ = &PTR_search_00236b98;
  local_9c._12_8_ = pos;
  local_60.maybeFunc.ptr.field_1.value.success = (bool *)local_9c._4_8_;
  _::BTreeImpl::insert
            ((Iterator *)((long)local_9c + 0x14),(BTreeImpl *)&(table->indexes).erasedCount,
             (SearchKey *)&local_60);
  uVar6 = (ulong)local_88.row;
  if ((uVar6 == 0xe) || (MVar1.i = (local_88.leaf)->rows[uVar6].i, MVar1.i == 0)) {
LAB_0016d0a1:
    pvVar4 = memmove((local_88.leaf)->rows + uVar6 + 1,(local_88.leaf)->rows + uVar6,
                     (ulong)(local_88.row + 1) * -4 + 0x38);
    (local_88.leaf)->rows[uVar6].i = (int)pos + 1;
    bVar3 = false;
    aVar5 = extraout_RDX;
  }
  else {
    pvVar4 = (void *)(ulong)(MVar1.i - 1);
    uVar2 = *(uint *)((long)&(local_70->content).ptr + (long)pvVar4 * 4);
    aVar5.value._4_4_ = 0;
    aVar5.value._0_4_ = uVar2;
    bVar3 = true;
    if (uVar2 != local_9c._0_4_) goto LAB_0016d0a1;
  }
  pos = (size_t)aVar5;
  if (bVar3) {
    *this = (Impl<0UL,_false>)0x1;
    *(void **)(this + 8) = pvVar4;
  }
  else {
    local_60.maybeFunc.ptr.isSet = true;
    local_60.maybeFunc.ptr.field_1.value.success = (bool *)((long)local_9c + 0x14);
    local_60.maybeFunc.ptr.field_1.value.indexObj =
         (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)local_9c._4_8_;
    local_60.maybeFunc.ptr.field_1.value.pos = (size_t *)(local_9c + 0xc);
    *this = (Impl<0UL,_false>)0x0;
    local_88.tree._0_1_ = true;
    local_60.maybeFunc.ptr.field_1.value.table = table;
    local_60.maybeFunc.ptr.field_1.value.row = row;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
    ::~Deferred(&local_60);
    pos = (size_t)extraout_RDX_00;
  }
LAB_0016d12a:
  MVar7.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
       (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pos;
  MVar7.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar7.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }